

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtr.c
# Opt level: O1

Vec_Ptr_t * Bac_PtrTransformBox(Vec_Ptr_t *vBox,Vec_Ptr_t *vGatesNames)

{
  int iVar1;
  char *__s;
  uint uVar2;
  Vec_Ptr_t *vBox_00;
  void **ppvVar3;
  size_t sVar4;
  char *__dest;
  uint uVar5;
  long lVar6;
  
  iVar1 = vBox->nSize;
  if ((long)iVar1 < 0) {
    __assert_fail("nCap >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                  ,99,"Vec_Ptr_t *Vec_PtrAllocExact(int)");
  }
  vBox_00 = (Vec_Ptr_t *)malloc(0x10);
  vBox_00->nSize = 0;
  vBox_00->nCap = iVar1;
  if (iVar1 == 0) {
    ppvVar3 = (void **)0x0;
  }
  else {
    ppvVar3 = (void **)malloc((long)iVar1 << 3);
  }
  vBox_00->pArray = ppvVar3;
  if (0 < vBox->nSize) {
    uVar5 = vBox_00->nCap;
    iVar1 = vBox_00->nSize;
    ppvVar3 = vBox_00->pArray;
    lVar6 = 0;
    do {
      __s = (char *)vBox->pArray[lVar6];
      if (__s == (char *)0x0) {
        __dest = (char *)0x0;
      }
      else {
        sVar4 = strlen(__s);
        __dest = (char *)malloc(sVar4 + 1);
        strcpy(__dest,__s);
      }
      if (iVar1 + (int)lVar6 == uVar5) {
        if ((int)uVar5 < 0x10) {
          if (ppvVar3 == (void **)0x0) {
            ppvVar3 = (void **)malloc(0x80);
          }
          else {
            ppvVar3 = (void **)realloc(ppvVar3,0x80);
          }
          uVar5 = 0x10;
        }
        else {
          uVar2 = uVar5 * 2;
          if (SBORROW4(uVar5,uVar2) != 0 < (int)uVar5) {
            uVar5 = uVar2;
            if (ppvVar3 == (void **)0x0) {
              ppvVar3 = (void **)malloc((ulong)uVar2 << 3);
            }
            else {
              ppvVar3 = (void **)realloc(ppvVar3,(ulong)uVar2 << 3);
            }
          }
        }
      }
      ppvVar3[iVar1 + lVar6] = __dest;
      lVar6 = lVar6 + 1;
    } while (lVar6 < vBox->nSize);
    vBox_00->nSize = iVar1 + (int)lVar6;
    vBox_00->nCap = uVar5;
    vBox_00->pArray = ppvVar3;
  }
  if (vGatesNames != (Vec_Ptr_t *)0x0) {
    Bac_PtrUpdateBox(vBox_00,vGatesNames);
  }
  return vBox_00;
}

Assistant:

Vec_Ptr_t * Bac_PtrTransformBox( Vec_Ptr_t * vBox, Vec_Ptr_t * vGatesNames )
{
    char * pName; int i;
    Vec_Ptr_t * vNew = Vec_PtrAllocExact( Vec_PtrSize(vBox) );
    Vec_PtrForEachEntry( char *, vBox, pName, i )
        Vec_PtrPush( vNew, Abc_UtilStrsav(pName) );
    if ( vGatesNames )
        Bac_PtrUpdateBox( vNew, vGatesNames );
    return vNew;
}